

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O1

Spectrum __thiscall
CMU462::DiffuseBSDF::sample_f(DiffuseBSDF *this,Vector3D *wo,Vector3D *wi,float *pdf)

{
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float in_XMM1_Da;
  Spectrum SVar1;
  Vector3D local_40;
  
  CosineWeightedHemisphereSampler3D::get_sample(&local_40,&this->sampler);
  wi->z = local_40.z;
  wi->x = local_40.x;
  wi->y = local_40.y;
  *pdf = (float)(wi->z / 3.141592653589793);
  (**(this->super_BSDF)._vptr_BSDF)(this,wo,wi);
  SVar1.g = (float)extraout_XMM0_Db;
  SVar1.r = (float)extraout_XMM0_Da;
  SVar1.b = in_XMM1_Da;
  return SVar1;
}

Assistant:

Spectrum DiffuseBSDF::sample_f(const Vector3D& wo, Vector3D* wi, float* pdf) {
	// TODO (PathTracer):
	// Implement DiffuseBSDF

	// use Cosine-Weighted sampling
	*wi = sampler.get_sample();
	*pdf = wi->z / PI; // wi->z = cos(theta)

	return f(wo,*wi);
}